

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::FboTestUtil::Texture2DShader::Texture2DShader
          (Texture2DShader *this,DataTypes *samplerTypes,DataType outputType,Vec4 *outScale,
          Vec4 *outBias)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  Vector<float,_4> local_170;
  Vector<float,_4> local_160;
  int local_150;
  int ndx;
  ShaderProgramDeclaration local_140;
  Vec4 *local_30;
  Vec4 *outBias_local;
  Vec4 *outScale_local;
  vector<glu::DataType,_std::allocator<glu::DataType>_> *pvStack_18;
  DataType outputType_local;
  DataTypes *samplerTypes_local;
  Texture2DShader *this_local;
  
  local_30 = outBias;
  outBias_local = outScale;
  outScale_local._4_4_ = outputType;
  pvStack_18 = &samplerTypes->vec;
  samplerTypes_local = (DataTypes *)this;
  genTexture2DShaderDecl(&local_140,samplerTypes,outputType);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,&local_140);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_011c4c58;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_011c4c90;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_011c4ca8;
  std::
  vector<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
  ::vector(&this->m_inputs);
  tcu::Vector<float,_4>::Vector(&this->m_outScale,outBias_local);
  tcu::Vector<float,_4>::Vector(&this->m_outBias,local_30);
  this->m_outputType = outScale_local._4_4_;
  sVar3 = std::vector<glu::DataType,_std::allocator<glu::DataType>_>::size(pvStack_18);
  std::
  vector<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
  ::resize(&this->m_inputs,sVar3);
  local_150 = 0;
  while( true ) {
    iVar1 = local_150;
    sVar3 = std::
            vector<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
            ::size(&this->m_inputs);
    iVar2 = local_150;
    if ((int)sVar3 <= iVar1) break;
    pvVar4 = std::
             vector<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
             ::operator[](&this->m_inputs,(long)local_150);
    pvVar4->unitNdx = iVar2;
    tcu::Vector<float,_4>::Vector(&local_160,1.0);
    pvVar4 = std::
             vector<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
             ::operator[](&this->m_inputs,(long)local_150);
    *(undefined8 *)(pvVar4->scale).m_data = local_160.m_data._0_8_;
    *(undefined8 *)((pvVar4->scale).m_data + 2) = local_160.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_170,0.0);
    pvVar4 = std::
             vector<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input,_std::allocator<deqp::gles31::Functional::FboTestUtil::Texture2DShader::Input>_>
             ::operator[](&this->m_inputs,(long)local_150);
    *(undefined8 *)(pvVar4->bias).m_data = local_170.m_data._0_8_;
    *(undefined8 *)((pvVar4->bias).m_data + 2) = local_170.m_data._8_8_;
    local_150 = local_150 + 1;
  }
  return;
}

Assistant:

Texture2DShader::Texture2DShader (const DataTypes& samplerTypes, glu::DataType outputType, const Vec4& outScale, const Vec4& outBias)
	: sglr::ShaderProgram	(genTexture2DShaderDecl(samplerTypes, outputType))
	, m_outScale			(outScale)
	, m_outBias				(outBias)
	, m_outputType			(outputType)
{
	m_inputs.resize(samplerTypes.vec.size());

	// Initialize units.
	for (int ndx = 0; ndx < (int)m_inputs.size(); ndx++)
	{
		m_inputs[ndx].unitNdx	= ndx;
		m_inputs[ndx].scale		= Vec4(1.0f);
		m_inputs[ndx].bias		= Vec4(0.0f);
	}
}